

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void embree::errorFunc(int error,char *description)

{
  runtime_error *this;
  allocator *__rhs;
  undefined3 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  uVar1 = CONCAT13(1,in_stack_ffffffffffffff98);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  __rhs = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Error: ",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff9c,uVar1),(char *)__rhs);
  std::runtime_error::runtime_error(this,local_30);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void errorFunc(int error, const char* description) {
    throw std::runtime_error(std::string("Error: ")+description);
  }